

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int rn,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  uint uVar1;
  uint *puVar2;
  bool bVar3;
  int iVar4;
  fpclass_type fVar5;
  int32_t iVar6;
  int *piVar7;
  uint uVar8;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *vec_00;
  int iVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  uint local_2a8;
  int *local_290;
  cpp_dec_float<100U,_int,_void> local_288;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_230;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_228;
  int *local_220;
  int *local_218;
  long local_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  cpp_dec_float<100U,_int,_void> local_1c8;
  cpp_dec_float<100U,_int,_void> local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  
  local_88.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
  local_88.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
  local_88.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
  local_88.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
  local_88.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
  local_88.m_backend.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
  local_88.m_backend.data._M_elems._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
  local_88.m_backend.data._M_elems._56_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
  local_88.m_backend.exp = (eps->m_backend).exp;
  local_88.m_backend.neg = (eps->m_backend).neg;
  local_88.m_backend.fpclass = (eps->m_backend).fpclass;
  local_88.m_backend.prec_elem = (eps->m_backend).prec_elem;
  vSolveLright(this,rhs,ridx,&rn,&local_88);
  local_230 = this;
  local_228 = vec;
  local_220 = idx;
  if (forest == (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)0x0) {
    if (rn < 1) {
      local_2a8 = 0;
    }
    else {
      piVar7 = (this->row).perm;
      lVar12 = 0;
      local_2a8 = 0;
      do {
        iVar4 = ridx[lVar12];
        local_288.exp = rhs[iVar4].m_backend.exp;
        local_288.neg = rhs[iVar4].m_backend.neg;
        local_288.data._M_elems._0_8_ = *(undefined8 *)rhs[iVar4].m_backend.data._M_elems;
        local_288.data._M_elems._8_8_ = *(undefined8 *)(rhs[iVar4].m_backend.data._M_elems + 2);
        puVar2 = rhs[iVar4].m_backend.data._M_elems + 4;
        local_288.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        local_288.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
        puVar2 = rhs[iVar4].m_backend.data._M_elems + 8;
        local_288.data._M_elems._32_8_ = *(undefined8 *)puVar2;
        local_288.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
        puVar2 = rhs[iVar4].m_backend.data._M_elems + 0xc;
        local_288.data._M_elems._48_8_ = *(undefined8 *)puVar2;
        local_288.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
        local_288.fpclass = rhs[iVar4].m_backend.fpclass;
        local_288.prec_elem = rhs[iVar4].m_backend.prec_elem;
        local_1c8.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
        local_1c8.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
        local_1c8.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
        local_1c8.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
        local_1c8.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
        local_1c8.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
        local_1c8.data._M_elems._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
        local_1c8.data._M_elems._56_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
        local_1c8.exp = (eps->m_backend).exp;
        local_1c8.neg = (eps->m_backend).neg;
        local_1c8.fpclass = (eps->m_backend).fpclass;
        local_1c8.prec_elem = (eps->m_backend).prec_elem;
        if ((local_288.neg == true) &&
           (local_288.data._M_elems[0] != 0 || local_288.fpclass != cpp_dec_float_finite)) {
          local_288.neg = false;
        }
        if ((local_1c8.fpclass == cpp_dec_float_NaN || local_288.fpclass == cpp_dec_float_NaN) ||
           (iVar9 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              (&local_288,&local_1c8), iVar9 < 1)) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                    (&rhs[iVar4].m_backend,0);
        }
        else {
          iVar4 = piVar7[iVar4];
          uVar10 = local_2a8;
          if (0 < (int)local_2a8) {
            do {
              uVar1 = uVar10 - 1;
              uVar8 = uVar1 >> 1;
              if (iVar4 <= ridx[uVar8]) break;
              ridx[uVar10] = ridx[uVar8];
              uVar10 = uVar8;
            } while (1 < uVar1);
          }
          local_2a8 = local_2a8 + 1;
          ridx[(int)uVar10] = iVar4;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < rn);
    }
  }
  else {
    if (rn < 1) {
      local_2a8 = 0;
    }
    else {
      local_290 = forestIdx;
      local_218 = (this->row).perm;
      lVar12 = 0;
      local_2a8 = 0;
      do {
        lVar11 = (long)ridx[lVar12];
        local_208 = *(undefined8 *)rhs[lVar11].m_backend.data._M_elems;
        uStack_200 = *(undefined8 *)(rhs[lVar11].m_backend.data._M_elems + 2);
        puVar2 = rhs[lVar11].m_backend.data._M_elems + 4;
        local_1f8 = *(undefined8 *)puVar2;
        uStack_1f0 = *(undefined8 *)(puVar2 + 2);
        puVar2 = rhs[lVar11].m_backend.data._M_elems + 8;
        local_1e8 = *(undefined8 *)puVar2;
        uStack_1e0 = *(undefined8 *)(puVar2 + 2);
        puVar2 = rhs[lVar11].m_backend.data._M_elems + 0xc;
        local_1d8 = *(undefined8 *)puVar2;
        uStack_1d0 = *(undefined8 *)(puVar2 + 2);
        iVar4 = rhs[lVar11].m_backend.exp;
        bVar3 = rhs[lVar11].m_backend.neg;
        fVar5 = rhs[lVar11].m_backend.fpclass;
        iVar6 = rhs[lVar11].m_backend.prec_elem;
        local_288.data._M_elems._0_8_ = *(undefined8 *)rhs[lVar11].m_backend.data._M_elems;
        local_288.data._M_elems._8_8_ = *(undefined8 *)(rhs[lVar11].m_backend.data._M_elems + 2);
        puVar2 = rhs[lVar11].m_backend.data._M_elems + 4;
        local_288.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        local_288.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
        puVar2 = rhs[lVar11].m_backend.data._M_elems + 8;
        local_288.data._M_elems._32_8_ = *(undefined8 *)puVar2;
        local_288.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
        puVar2 = rhs[lVar11].m_backend.data._M_elems + 0xc;
        local_288.data._M_elems._48_8_ = *(undefined8 *)puVar2;
        local_288.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
        local_178.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
        local_178.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
        local_178.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
        local_178.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
        local_178.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
        local_178.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
        local_178.data._M_elems._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
        local_178.data._M_elems._56_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
        local_178.exp = (eps->m_backend).exp;
        local_178.neg = (eps->m_backend).neg;
        local_178.fpclass = (eps->m_backend).fpclass;
        local_178.prec_elem = (eps->m_backend).prec_elem;
        local_288.prec_elem = iVar6;
        local_288.fpclass = fVar5;
        local_288.neg = bVar3;
        if ((bVar3 == true) && (local_288.data._M_elems[0] != 0 || fVar5 != cpp_dec_float_finite)) {
          local_288.neg = false;
        }
        local_288.exp = iVar4;
        if ((local_178.fpclass == cpp_dec_float_NaN || fVar5 == cpp_dec_float_NaN) ||
           (local_210 = lVar11,
           iVar9 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (&local_288,&local_178), iVar9 < 1)) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                    (&rhs[lVar11].m_backend,0);
        }
        else {
          *local_290 = (int)local_210;
          iVar9 = local_218[local_210];
          uVar10 = local_2a8;
          if (0 < (int)local_2a8) {
            do {
              uVar1 = uVar10 - 1;
              uVar8 = uVar1 >> 1;
              if (iVar9 <= ridx[uVar8]) break;
              ridx[uVar10] = ridx[uVar8];
              uVar10 = uVar8;
            } while (1 < uVar1);
          }
          local_290 = local_290 + 1;
          local_2a8 = local_2a8 + 1;
          ridx[(int)uVar10] = iVar9;
          puVar2 = forest[lVar11].m_backend.data._M_elems + 0xc;
          *(undefined8 *)puVar2 = local_1d8;
          *(undefined8 *)(puVar2 + 2) = uStack_1d0;
          puVar2 = forest[lVar11].m_backend.data._M_elems + 8;
          *(undefined8 *)puVar2 = local_1e8;
          *(undefined8 *)(puVar2 + 2) = uStack_1e0;
          puVar2 = forest[lVar11].m_backend.data._M_elems + 4;
          *(undefined8 *)puVar2 = local_1f8;
          *(undefined8 *)(puVar2 + 2) = uStack_1f0;
          *(undefined8 *)forest[lVar11].m_backend.data._M_elems = local_208;
          *(undefined8 *)(forest[lVar11].m_backend.data._M_elems + 2) = uStack_200;
          forest[lVar11].m_backend.exp = iVar4;
          forest[lVar11].m_backend.neg = bVar3;
          forest[lVar11].m_backend.fpclass = fVar5;
          forest[lVar11].m_backend.prec_elem = iVar6;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < rn);
    }
    *forestNum = local_2a8;
  }
  piVar7 = local_220;
  vec_00 = local_228;
  this_00 = local_230;
  local_d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
  local_d8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
  local_d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
  local_d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
  local_d8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
  local_d8.m_backend.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
  local_d8.m_backend.data._M_elems._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
  local_d8.m_backend.data._M_elems._56_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
  local_d8.m_backend.exp = (eps->m_backend).exp;
  local_d8.m_backend.neg = (eps->m_backend).neg;
  local_d8.m_backend.fpclass = (eps->m_backend).fpclass;
  local_d8.m_backend.prec_elem = (eps->m_backend).prec_elem;
  rn = local_2a8;
  rn = vSolveUright(local_230,local_228,local_220,rhs,ridx,local_2a8,&local_d8);
  if ((this_00->l).updateType == 0) {
    local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
    local_128.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
    local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
    local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
    local_128.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
    local_128.m_backend.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
    local_128.m_backend.data._M_elems._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc)
    ;
    local_128.m_backend.data._M_elems._56_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe)
    ;
    local_128.m_backend.exp = (eps->m_backend).exp;
    local_128.m_backend.neg = (eps->m_backend).neg;
    local_128.m_backend.fpclass = (eps->m_backend).fpclass;
    local_128.m_backend.prec_elem = (eps->m_backend).prec_elem;
    rn = vSolveUpdateRight(this_00,vec_00,piVar7,rn,&local_128);
  }
  return rn;
}

Assistant:

int CLUFactor<R>::vSolveRight4update(R eps,
                                     R* vec, int* idx,                       /* result */
                                     R* rhs, int* ridx, int rn,              /* rhs    */
                                     R* forest, int* forestNum, int* forestIdx)
{
   vSolveLright(rhs, ridx, rn, eps);
   assert(rn >= 0 && rn <= thedim);

   /*  turn index list into a heap
    */

   if(forest)
   {
      R x;
      int i, j, k;
      int* rperm;
      int* it = forestIdx;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
      rn = vSolveUpdateRight(vec, idx, rn, eps);

   return rn;
}